

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O2

int pt_evt_apply_tma(pt_time *time,pt_time_cal *tcal,pt_packet_tma *packet,pt_config *config)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pt_tcal_update_tma(tcal,packet,config);
  if (-1 < (int)uVar1 || uVar1 == 0xfffffff6) {
    uVar2 = pt_time_update_tma(time,packet,config);
    uVar1 = 0;
    if (uVar2 != 0xfffffff6) {
      uVar1 = (int)uVar2 >> 0x1f & uVar2;
    }
  }
  return uVar1;
}

Assistant:

static int pt_evt_apply_tma(struct pt_time *time, struct pt_time_cal *tcal,
			    const struct pt_packet_tma *packet,
			    const struct pt_config *config)
{
	int errcode;

	/* We ignore configuration errors.  They will result in imprecise
	 * calibration which will result in imprecise cycle-accurate timing.
	 */
	errcode = pt_tcal_update_tma(tcal, packet, config);
	if ((errcode < 0) && (errcode != -pte_bad_config))
		return errcode;

	/* We ignore configuration errors.  They will result in imprecise
	 * timing and are tracked as packet losses in struct pt_time.
	 */
	errcode = pt_time_update_tma(time, packet, config);
	if ((errcode < 0) && (errcode != -pte_bad_config))
		return errcode;

	return 0;
}